

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

ImportBaseFuncWrapper * __thiscall
ImportBaseDirWrapper::thunkToFunction(ImportBaseDirWrapper *this,offset_t thunk)

{
  int iVar1;
  ImportBaseEntryWrapper *pIVar2;
  iterator iVar3;
  undefined4 extraout_var;
  ImportBaseFuncWrapper *pIVar4;
  offset_t local_10;
  
  local_10 = thunk;
  pIVar2 = thunkToLib(this,thunk);
  if ((pIVar2 != (ImportBaseEntryWrapper *)0x0) &&
     (iVar3 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::find(&(pIVar2->thunkToFuncMap)._M_t,&local_10),
     (_Rb_tree_header *)iVar3._M_node !=
     &(pIVar2->thunkToFuncMap)._M_t._M_impl.super__Rb_tree_header)) {
    iVar1 = (*(pIVar2->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x20])
                      (pIVar2,iVar3._M_node[1]._M_parent);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      pIVar4 = (ImportBaseFuncWrapper *)
               __dynamic_cast(CONCAT44(extraout_var,iVar1),&ExeNodeWrapper::typeinfo,
                              &ImportBaseFuncWrapper::typeinfo,0);
      return pIVar4;
    }
  }
  return (ImportBaseFuncWrapper *)0x0;
}

Assistant:

ImportBaseFuncWrapper* ImportBaseDirWrapper::thunkToFunction(offset_t thunk)
{
    ImportBaseEntryWrapper* lib = thunkToLib(thunk);
    if (!lib) return NULL;

    std::map<offset_t, size_t>::iterator funcItr = lib->thunkToFuncMap.find(thunk);
    if (funcItr == lib->thunkToFuncMap.end()) return NULL;

    ImportBaseFuncWrapper* func = dynamic_cast<ImportBaseFuncWrapper*>(lib->getEntryAt(funcItr->second));
    return func;
}